

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestBuildHandler::GetMakeCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  string configType;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"MakeCommand","");
  cmCTest::GetCTestConfiguration(__return_storage_ptr__,pcVar1,(string *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"MakeCommand:",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x123,local_1e0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar2,pcVar2 + psVar5->_M_string_length);
  iVar3 = std::__cxx11::string::compare(local_1a0);
  if (iVar3 == 0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,"DefaultCTestConfigurationType","");
    cmCTest::GetCTestConfiguration(&local_1e0,pcVar1,&local_1c0);
    std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::string::compare(local_1a0);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)local_1a0,0,(char *)local_1a0._8_8_,0x59b9a1);
  }
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"${CTEST_CONFIGURATION_TYPE}",(char *)local_1a0._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBuildHandler::GetMakeCommand()
{
  std::string makeCommand
    = this->CTest->GetCTestConfiguration("MakeCommand");
  cmCTestOptionalLog(this->CTest,
    HANDLER_VERBOSE_OUTPUT, "MakeCommand:" << makeCommand << "\n",
    this->Quiet);

  std::string configType = this->CTest->GetConfigType();
  if (configType == "")
    {
    configType
      = this->CTest->GetCTestConfiguration("DefaultCTestConfigurationType");
    }
  if (configType == "")
    {
    configType = "Release";
    }

  cmSystemTools::ReplaceString(makeCommand,
    "${CTEST_CONFIGURATION_TYPE}", configType.c_str());

  return makeCommand;
}